

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

lu_mem singlestep(lua_State *L)

{
  global_State *g;
  GCObject *pGVar1;
  GCObject *pGVar2;
  lu_mem lVar3;
  GCObject *pGVar4;
  lu_mem lVar5;
  long lVar6;
  int iVar7;
  lu_mem lVar8;
  lua_State *plVar9;
  GCObject *pGVar10;
  GCObject **ppGVar11;
  GCObject *pGVar12;
  l_mem lVar13;
  int iVar14;
  GCObject *f;
  GCObject *f_00;
  UpVal *pUVar15;
  lua_State **pplVar16;
  global_State *pgVar17;
  
  g = L->l_G;
  switch(g->gcstate) {
  case '\0':
    g->GCmemtrav = 0;
    propagatemark(g);
    if (g->gray == (GCObject *)0x0) {
      g->gcstate = '\x01';
    }
    goto LAB_0010d9f1;
  case '\x01':
    pgVar17 = g;
    if (g->gray != (GCObject *)0x0) {
      do {
        propagatemark(g);
      } while (g->gray != (GCObject *)0x0);
      pgVar17 = L->l_G;
    }
    pGVar1 = pgVar17->grayagain;
    pgVar17->gcstate = '\b';
    pgVar17->GCmemtrav = 0;
    if ((L->marked & 3) != 0) {
      reallymarkobject(pgVar17,(GCObject *)L);
    }
    if ((((pgVar17->l_registry).tt_ & 0x40) != 0) &&
       (pGVar2 = (pgVar17->l_registry).value_.gc, (pGVar2->marked & 3) != 0)) {
      reallymarkobject(pgVar17,pGVar2);
    }
    markmt(pgVar17);
    plVar9 = pgVar17->twups;
    if (plVar9 != (lua_State *)0x0) {
      pplVar16 = &pgVar17->twups;
      do {
        if (((plVar9->marked & 7) == 0) && (plVar9->openupval != (UpVal *)0x0)) {
          pplVar16 = &plVar9->twups;
        }
        else {
          *pplVar16 = plVar9->twups;
          plVar9->twups = plVar9;
          for (pUVar15 = plVar9->openupval; pUVar15 != (UpVal *)0x0;
              pUVar15 = (pUVar15->u).open.next) {
            if ((pUVar15->u).open.touched != 0) {
              if (((pUVar15->v->tt_ & 0x40) != 0) &&
                 (pGVar2 = (pUVar15->v->value_).gc, (pGVar2->marked & 3) != 0)) {
                reallymarkobject(pgVar17,pGVar2);
              }
              (pUVar15->u).open.touched = 0;
            }
          }
        }
        plVar9 = *pplVar16;
      } while (plVar9 != (lua_State *)0x0);
    }
    while (pgVar17->gray != (GCObject *)0x0) {
      propagatemark(pgVar17);
    }
    lVar8 = pgVar17->GCmemtrav;
    pgVar17->gray = pGVar1;
    while (pGVar1 != (GCObject *)0x0) {
      propagatemark(pgVar17);
      pGVar1 = pgVar17->gray;
    }
    pgVar17->GCmemtrav = 0;
    convergeephemerons(pgVar17);
    clearvalues(pgVar17,pgVar17->weak,(GCObject *)0x0);
    clearvalues(pgVar17,pgVar17->allweak,(GCObject *)0x0);
    lVar3 = pgVar17->GCmemtrav;
    pGVar1 = pgVar17->weak;
    pGVar2 = pgVar17->allweak;
    pGVar12 = (GCObject *)&pgVar17->tobefnz;
    do {
      pGVar10 = pGVar12;
      pGVar12 = pGVar10->next;
    } while (pGVar10->next != (GCObject *)0x0);
    if (pgVar17->finobj != (GCObject *)0x0) {
      ppGVar11 = &pgVar17->finobj;
      pGVar12 = pgVar17->finobj;
      do {
        if ((pGVar12->marked & 3) != 0) {
          *ppGVar11 = pGVar12->next;
          pGVar12->next = pGVar10->next;
          pGVar10->next = pGVar12;
          pGVar10 = pGVar12;
          pGVar12 = (GCObject *)ppGVar11;
        }
        pGVar4 = pGVar12->next;
        ppGVar11 = &pGVar12->next;
        pGVar12 = pGVar4;
      } while (pGVar4 != (GCObject *)0x0);
    }
    pgVar17->gcfinnum = 1;
    markbeingfnz(pgVar17);
    while (pgVar17->gray != (GCObject *)0x0) {
      propagatemark(pgVar17);
    }
    pgVar17->GCmemtrav = 0;
    convergeephemerons(pgVar17);
    clearkeys(pgVar17,pgVar17->ephemeron,f);
    clearkeys(pgVar17,pgVar17->allweak,f_00);
    clearvalues(pgVar17,pgVar17->weak,pGVar1);
    clearvalues(pgVar17,pgVar17->allweak,pGVar2);
    luaS_clearcache(pgVar17);
    pgVar17->currentwhite = pgVar17->currentwhite ^ 3;
    lVar5 = pgVar17->GCmemtrav;
    pgVar17 = L->l_G;
    pgVar17->gcstate = '\x02';
    ppGVar11 = sweeplist(L,&pgVar17->allgc,1);
    pgVar17->sweepgc = ppGVar11;
    g->GCestimate = g->GCdebt + g->totalbytes;
    return lVar3 + lVar8 + lVar5;
  case '\x02':
    ppGVar11 = &g->finobj;
    iVar7 = 3;
    break;
  case '\x03':
    ppGVar11 = &g->tobefnz;
    iVar7 = 4;
    break;
  case '\x04':
    iVar7 = 5;
    ppGVar11 = (GCObject **)0x0;
    break;
  case '\x05':
    g->mainthread->marked = g->currentwhite & 3 | g->mainthread->marked & 0xf8;
    if (g->gckind != '\x01') {
      lVar6 = g->GCdebt;
      iVar7 = (g->strt).size;
      iVar14 = iVar7 + 3;
      if (-1 < iVar7) {
        iVar14 = iVar7;
      }
      lVar13 = lVar6;
      if ((g->strt).nuse < iVar14 >> 2) {
        luaS_resize(L,iVar7 / 2);
        lVar13 = g->GCdebt;
      }
      g->GCestimate = g->GCestimate + (lVar13 - lVar6);
    }
    g->gcstate = '\x06';
    return 0;
  case '\x06':
    if ((g->tobefnz != (GCObject *)0x0) && (g->gckind != '\x01')) {
      iVar7 = runafewfinalizers(L);
      return (long)iVar7 * 7;
    }
    g->gcstate = '\a';
    return 0;
  case '\a':
    g->GCmemtrav = (long)(g->strt).size << 3;
    g->gray = (GCObject *)0x0;
    g->grayagain = (GCObject *)0x0;
    g->weak = (GCObject *)0x0;
    g->ephemeron = (GCObject *)0x0;
    g->allweak = (GCObject *)0x0;
    if ((g->mainthread->marked & 3) != 0) {
      reallymarkobject(g,(GCObject *)g->mainthread);
    }
    if ((((g->l_registry).tt_ & 0x40) != 0) &&
       (pGVar1 = (g->l_registry).value_.gc, (pGVar1->marked & 3) != 0)) {
      reallymarkobject(g,pGVar1);
    }
    markmt(g);
    markbeingfnz(g);
    g->gcstate = '\0';
LAB_0010d9f1:
    return g->GCmemtrav;
  default:
    return 0;
  }
  lVar8 = sweepstep(L,g,iVar7,ppGVar11);
  return lVar8;
}

Assistant:

static lu_mem singlestep(lua_State *L) {
    global_State *g = G(L);
    switch (g->gcstate) {
        case GCSpause: {
            g->GCmemtrav = g->strt.size * sizeof(GCObject *);
            restartcollection(g);
            g->gcstate = GCSpropagate;
            return g->GCmemtrav;
        }
        case GCSpropagate: {
            g->GCmemtrav = 0;
            lua_assert(g->gray);
            propagatemark(g);
            if (g->gray == NULL)  /* no more gray objects? */
                g->gcstate = GCSatomic;  /* finish propagate phase */
            return g->GCmemtrav;  /* memory traversed in this step */
        }
        case GCSatomic: {
            lu_mem work;
            propagateall(g);  /* make sure gray list is empty */
            work = atomic(L);  /* work is what was traversed by 'atomic' */
            entersweep(L);
            g->GCestimate = gettotalbytes(g);  /* first estimate */;
            return work;
        }
        case GCSswpallgc: {  /* sweep "regular" objects */
            return sweepstep(L, g, GCSswpfinobj, &g->finobj);
        }
        case GCSswpfinobj: {  /* sweep objects with finalizers */
            return sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
        }
        case GCSswptobefnz: {  /* sweep objects to be finalized */
            return sweepstep(L, g, GCSswpend, NULL);
        }
        case GCSswpend: {  /* finish sweeps */
            makewhite(g, g->mainthread);  /* sweep main thread */
            checkSizes(L, g);
            g->gcstate = GCScallfin;
            return 0;
        }
        case GCScallfin: {  /* call remaining finalizers */
            if (g->tobefnz && g->gckind != KGC_EMERGENCY) {
                int n = runafewfinalizers(L);
                return (n * GCFINALIZECOST);
            } else {  /* emergency mode or no more finalizers */
                g->gcstate = GCSpause;  /* finish collection */
                return 0;
            }
        }
        default:
            lua_assert(0);
            return 0;
    }
}